

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void tests::hylo_performance(void)

{
  N *right_00;
  N *this;
  NS *pNVar1;
  ostream *poVar2;
  rep rVar3;
  void *this_00;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> duration;
  time_point stop;
  vector<N_*,_std::allocator<N_*>_> *in_stack_00000098;
  Alg<double> *in_stack_000000a0;
  N *in_stack_000000a8;
  double res;
  time_point start;
  N *right;
  N *left;
  NS *expr;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_fffffffffffffef8;
  N *in_stack_ffffffffffffff00;
  NS *in_stack_ffffffffffffff08;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *__lhs;
  N *in_stack_ffffffffffffff10;
  vector<N_*,_std::allocator<N_*>_> *this_01;
  duration<long,_std::ratio<1L,_1000000000L>_> local_a8;
  undefined8 local_a0;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  in_stack_ffffffffffffff68;
  N *in_stack_ffffffffffffff70;
  
  right_00 = (N *)operator_new(0x18);
  (right_00->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (right_00->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (right_00->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  NS::NS((NS *)0x179b9c);
  this = (N *)N::operator_new((size_t)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  N::N<char_const*>(this,(char *)right_00);
  pNVar1 = (NS *)N::operator_new((size_t)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  N::N<char_const*>(this,(char *)right_00);
  std::chrono::_V2::system_clock::now();
  N::operator_new((size_t)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  N::N<int>(in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
  coalg::rand_btree(pNVar1,this,right_00);
  N::ana<int>(in_stack_ffffffffffffff70,(CoAlg<int> *)in_stack_ffffffffffffff68.__d.__r);
  alg::btree_avg(right_00,in_stack_ffffffffffffff10);
  __lhs = (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
           *)&stack0xffffffffffffff68;
  std::vector<N_*,_std::allocator<N_*>_>::vector((vector<N_*,_std::allocator<N_*>_> *)0x179cc7);
  this_01 = (vector<N_*,_std::allocator<N_*>_> *)
            N::histo<double>(in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
  std::vector<N_*,_std::allocator<N_*>_>::~vector(this_01);
  std::function<double_(N_&,_std::vector<N_*,_std::allocator<N_*>_>_&)>::~function
            ((function<double_(N_&,_std::vector<N_*,_std::allocator<N_*>_>_&)> *)0x179cfd);
  std::function<N_*(int_&)>::~function((function<N_*(int_&)> *)0x179d0a);
  local_a0 = std::chrono::_V2::system_clock::now();
  std::chrono::operator-
            (__lhs,(time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_ffffffffffffff00);
  local_a8.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                                (in_stack_fffffffffffffef8);
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,(double)this_01);
  poVar2 = std::operator<<(poVar2,", ");
  rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_a8);
  this_00 = (void *)std::ostream::operator<<(poVar2,rVar3);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  pNVar1 = NS::clear((NS *)this);
  if (pNVar1 != (NS *)0x0) {
    NS::~NS((NS *)0x179db8);
    operator_delete(pNVar1,0x18);
  }
  return;
}

Assistant:

void hylo_performance() {
        //             ana       cata      hylo
        // C++ T      6159555   3626070    9497513
        // Python    33156637  10476905   46028639
        // Python T 697323327 668245419 1467391795
        auto expr = new NS();
        auto left = new(expr) N("Left"), right = new(expr) N("Right");

        auto start = high_resolution_clock::now();
        auto res = (new(expr) N(1000000))->
                ana(coalg::rand_btree(expr, left, right))->
                histo(alg::btree_avg(left, right));
        auto stop = high_resolution_clock::now();

        auto duration = duration_cast<nanoseconds>(stop - start);
        cout << res << ", " << duration.count() << endl;

        delete expr->clear();
    }